

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O0

int amrex::EB2::maxCoarseningLevel(Geometry *geom)

{
  uint uVar1;
  undefined8 uVar2;
  Box cdomain_00;
  int iVar3;
  IndexSpace *pIVar4;
  undefined4 extraout_var;
  Geometry *in_RDI;
  Box *cdomain;
  Box bx;
  Box *domain;
  int i;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 *puVar6;
  undefined8 local_84;
  undefined8 local_7c;
  undefined8 local_74;
  undefined4 local_6c;
  undefined8 *local_68;
  Box *local_58;
  int local_4c;
  undefined8 *local_48;
  int local_3c;
  undefined4 *local_38;
  undefined4 local_30;
  int local_2c;
  long local_28;
  undefined4 *local_20;
  int local_14;
  undefined4 *local_10;
  int local_4;
  undefined8 *puVar5;
  
  local_58 = Geometry::Domain(in_RDI);
  local_84 = *(undefined8 *)(local_58->smallend).vect;
  local_7c = *(undefined8 *)((local_58->smallend).vect + 2);
  uVar2 = *(undefined8 *)((local_58->bigend).vect + 1);
  uVar1 = (local_58->btype).itype;
  puVar6 = &local_84;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_38 = &local_6c;
    local_3c = local_4c;
    local_14 = local_4c;
    local_4 = local_4c;
    if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) != 0) {
      local_28 = (long)&local_7c + 4;
      local_2c = local_4c;
      local_30 = 0xffffffff;
      *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + -1;
    }
    local_10 = local_38;
  }
  local_20 = &local_6c;
  local_6c = 0;
  local_68 = &local_84;
  local_74 = uVar2;
  local_48 = puVar6;
  pIVar4 = IndexSpace::top();
  iVar3 = (*pIVar4->_vptr_IndexSpace[4])();
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  cdomain_00.smallend.vect[1] = in_stack_ffffffffffffff44;
  cdomain_00.smallend.vect[0] = *(undefined4 *)(puVar5 + 3);
  cdomain_00._8_8_ = puVar6;
  cdomain_00.bigend.vect._4_8_ = *puVar5;
  cdomain_00.btype.itype = (uint)(Box *)puVar5[1];
  iVar3 = anon_unknown_45::comp_max_crse_level(cdomain_00,(Box *)puVar5[1]);
  return iVar3;
}

Assistant:

int
maxCoarseningLevel (const Geometry& geom)
{
    const Box& domain = amrex::enclosedCells(geom.Domain());
    const Box& cdomain = IndexSpace::top().coarsestDomain();
    return comp_max_crse_level(cdomain, domain);
}